

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalInsert::Deserialize(LogicalInsert *this,Deserializer *deserializer)

{
  LogicalInsert *this_00;
  ClientContext *context;
  pointer pLVar1;
  _Head_base<0UL,_duckdb::LogicalInsert_*,_false> local_30;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_28;
  CreateInfo *local_20;
  
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            ((Deserializer *)&stack0xffffffffffffffe0,(field_id_t)deserializer,(char *)0xc8);
  this_00 = (LogicalInsert *)operator_new(0x1d0);
  context = SerializationData::Get<duckdb::ClientContext&>(&deserializer->data);
  local_28._M_head_impl = local_20;
  local_20 = (CreateInfo *)0x0;
  LogicalInsert(this_00,context,
                (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                &local_28);
  local_30._M_head_impl = this_00;
  if (local_28._M_head_impl != (CreateInfo *)0x0) {
    (*((local_28._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_28._M_head_impl = (CreateInfo *)0x0;
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,true>>
            (deserializer,0xc9,"insert_values",&pLVar1->insert_values);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::ReadProperty<duckdb::IndexVector<unsigned_long,duckdb::PhysicalIndex>>
            (deserializer,0xca,"column_index_map",&pLVar1->column_index_map);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0xcb,"expected_types",&pLVar1->expected_types);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0xcc,"table_index",&pLVar1->table_index);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0xcd,"return_chunk",&pLVar1->return_chunk);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,0xce,"bound_defaults",&pLVar1->bound_defaults);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::ReadProperty<duckdb::OnConflictAction>
            (deserializer,0xcf,"action_type",&pLVar1->action_type);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0xd0,"expected_set_types",&pLVar1->expected_set_types);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::
  ReadPropertyWithDefault<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
            (deserializer,0xd1,"on_conflict_filter",&pLVar1->on_conflict_filter);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (deserializer,0xd2,"on_conflict_condition",&pLVar1->on_conflict_condition);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (deserializer,0xd3,"do_update_condition",&pLVar1->do_update_condition);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::PhysicalIndex,true>>
            (deserializer,0xd4,"set_columns",&pLVar1->set_columns);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0xd5,"set_types",&pLVar1->set_types);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0xd6,"excluded_table_index",&pLVar1->excluded_table_index);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (deserializer,0xd7,"columns_to_fetch",&pLVar1->columns_to_fetch);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (deserializer,0xd8,"source_columns",&pLVar1->source_columns);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,0xd9,"expressions",&(pLVar1->super_LogicalOperator).expressions);
  pLVar1 = unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>::
           operator->((unique_ptr<duckdb::LogicalInsert,_std::default_delete<duckdb::LogicalInsert>,_true>
                       *)&local_30);
  Deserializer::ReadPropertyWithExplicitDefault<bool>
            (deserializer,0xda,"update_is_del_and_insert",&pLVar1->update_is_del_and_insert,false);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)local_30._M_head_impl;
  if (local_20 != (CreateInfo *)0x0) {
    (**(code **)(*(_func_int **)local_20 + 8))();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalInsert::Deserialize(Deserializer &deserializer) {
	auto table_info = deserializer.ReadPropertyWithDefault<unique_ptr<CreateInfo>>(200, "table_info");
	auto result = duckdb::unique_ptr<LogicalInsert>(new LogicalInsert(deserializer.Get<ClientContext &>(), std::move(table_info)));
	deserializer.ReadPropertyWithDefault<vector<vector<unique_ptr<Expression>>>>(201, "insert_values", result->insert_values);
	deserializer.ReadProperty<IndexVector<idx_t, PhysicalIndex>>(202, "column_index_map", result->column_index_map);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(203, "expected_types", result->expected_types);
	deserializer.ReadPropertyWithDefault<idx_t>(204, "table_index", result->table_index);
	deserializer.ReadPropertyWithDefault<bool>(205, "return_chunk", result->return_chunk);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(206, "bound_defaults", result->bound_defaults);
	deserializer.ReadProperty<OnConflictAction>(207, "action_type", result->action_type);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(208, "expected_set_types", result->expected_set_types);
	deserializer.ReadPropertyWithDefault<unordered_set<idx_t>>(209, "on_conflict_filter", result->on_conflict_filter);
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(210, "on_conflict_condition", result->on_conflict_condition);
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(211, "do_update_condition", result->do_update_condition);
	deserializer.ReadPropertyWithDefault<vector<PhysicalIndex>>(212, "set_columns", result->set_columns);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(213, "set_types", result->set_types);
	deserializer.ReadPropertyWithDefault<idx_t>(214, "excluded_table_index", result->excluded_table_index);
	deserializer.ReadPropertyWithDefault<vector<column_t>>(215, "columns_to_fetch", result->columns_to_fetch);
	deserializer.ReadPropertyWithDefault<vector<column_t>>(216, "source_columns", result->source_columns);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(217, "expressions", result->expressions);
	deserializer.ReadPropertyWithExplicitDefault<bool>(218, "update_is_del_and_insert", result->update_is_del_and_insert, false);
	return std::move(result);
}